

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.c
# Opt level: O3

int GetResidualCost_C(int ctx0,VP8Residual *res)

{
  byte bVar1;
  int iVar2;
  ProbaArray *paauVar3;
  long lVar4;
  long lVar5;
  uint8_t (*pauVar6) [11];
  uint uVar7;
  ushort uVar8;
  ushort uVar9;
  uint16_t *puVar10;
  int iVar11;
  CostArrayPtr papuVar12;
  long lVar13;
  uint uVar14;
  
  iVar11 = res->first;
  paauVar3 = res->prob;
  lVar4 = (long)iVar11;
  bVar1 = paauVar3[lVar4][ctx0][0];
  uVar7 = 0;
  if (ctx0 == 0) {
    uVar7 = (uint)VP8EntropyCost[(byte)~bVar1];
  }
  iVar2 = res->last;
  lVar13 = (long)iVar2;
  if (lVar13 < 0) {
    uVar7 = (uint)VP8EntropyCost[bVar1];
  }
  else {
    puVar10 = res->costs[lVar4][ctx0];
    lVar5 = lVar4;
    if (iVar11 < iVar2) {
      papuVar12 = res->costs + lVar4;
      do {
        papuVar12 = papuVar12 + 1;
        uVar9 = res->coeffs[lVar4];
        uVar8 = -uVar9;
        if (0 < (short)uVar9) {
          uVar8 = uVar9;
        }
        uVar14 = 0x43;
        if (uVar8 < 0x43) {
          uVar14 = (uint)uVar8;
        }
        uVar7 = uVar7 + VP8LevelFixedCosts[uVar8] + (uint)puVar10[uVar14];
        lVar4 = lVar4 + 1;
        uVar14 = 2;
        if (uVar8 < 2) {
          uVar14 = (uint)uVar8;
        }
        puVar10 = (*papuVar12)[uVar14];
        lVar5 = lVar13;
        iVar11 = iVar2;
      } while (lVar13 != lVar4);
    }
    uVar9 = res->coeffs[lVar5];
    uVar8 = -uVar9;
    if (0 < (short)uVar9) {
      uVar8 = uVar9;
    }
    uVar9 = 0x43;
    if (uVar8 < 0x43) {
      uVar9 = uVar8;
    }
    uVar7 = VP8LevelFixedCosts[uVar8] + uVar7 + (uint)puVar10[uVar9];
    if (iVar11 < 0xf) {
      pauVar6 = *paauVar3 + 1;
      if (uVar8 != 1) {
        pauVar6 = *paauVar3 + 2;
      }
      uVar7 = uVar7 + VP8EntropyCost
                      [*(byte *)((long)pauVar6 +
                                (ulong)""[(long)iVar11 + 1] * 0x20 + (ulong)""[(long)iVar11 + 1])];
    }
  }
  return uVar7;
}

Assistant:

static int GetResidualCost_C(int ctx0, const VP8Residual* const res) {
  int n = res->first;
  // should be prob[VP8EncBands[n]], but it's equivalent for n=0 or 1
  const int p0 = res->prob[n][ctx0][0];
  CostArrayPtr const costs = res->costs;
  const uint16_t* t = costs[n][ctx0];
  // bit_cost(1, p0) is already incorporated in t[] tables, but only if ctx != 0
  // (as required by the syntax). For ctx0 == 0, we need to add it here or it'll
  // be missing during the loop.
  int cost = (ctx0 == 0) ? VP8BitCost(1, p0) : 0;

  if (res->last < 0) {
    return VP8BitCost(0, p0);
  }
  for (; n < res->last; ++n) {
    const int v = abs(res->coeffs[n]);
    const int ctx = (v >= 2) ? 2 : v;
    cost += VP8LevelCost(t, v);
    t = costs[n + 1][ctx];
  }
  // Last coefficient is always non-zero
  {
    const int v = abs(res->coeffs[n]);
    assert(v != 0);
    cost += VP8LevelCost(t, v);
    if (n < 15) {
      const int b = VP8EncBands[n + 1];
      const int ctx = (v == 1) ? 1 : 2;
      const int last_p0 = res->prob[b][ctx][0];
      cost += VP8BitCost(0, last_p0);
    }
  }
  return cost;
}